

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pNormalIdx,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  pointer piVar5;
  pointer piVar6;
  _List_node_base *p_Var7;
  unsigned_long uVar8;
  _List_node_base *p_Var9;
  aiVector3D *paVar10;
  long lVar11;
  runtime_error *prVar12;
  long *plVar13;
  size_type *psVar14;
  long *plVar15;
  _List_node_base *p_Var16;
  ulong uVar17;
  long lVar18;
  size_type __n;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tind;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> norm_arr_copy;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8;
  vector<int,_std::allocator<int>_> *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_d8 = pCoordIdx;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (&local_f8,
             (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var16 = (pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)pNormals) {
    do {
      if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>const&>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_f8,
                   (iterator)
                   local_f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(aiVector3t<float> *)(p_Var16 + 1));
      }
      else {
        (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish)->z = *(float *)&p_Var16[1]._M_prev;
        *(_List_node_base **)
         local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish = p_Var16[1]._M_next;
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var16 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var16 != (_List_node_base *)pNormals);
  }
  piVar5 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)piVar6 - (long)piVar5 >> 2;
  if (pNormalPerVertex) {
    if (piVar6 == piVar5) {
      uVar21 = (ulong)pMesh->mNumVertices;
      if ((pNormals->super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl._M_node._M_size != uVar21) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_138 = &local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,
                   "MeshGeometry_AddNormal. Normals and vertices count must be equal.","");
        std::runtime_error::runtime_error(prVar12,(string *)&local_138);
        *(undefined ***)prVar12 = &PTR__runtime_error_007fd498;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar10 = (aiVector3D *)operator_new__(uVar21 * 0xc);
      if (uVar21 != 0) {
        memset(paVar10,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      pMesh->mNormals = paVar10;
      if (pMesh->mNumVertices != 0) {
        p_Var16 = (pNormals->
                  super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                  _M_node.super__List_node_base._M_next;
        lVar11 = 0;
        uVar21 = 0;
        do {
          p_Var7 = p_Var16[1]._M_next;
          p_Var9 = p_Var16 + 1;
          p_Var16 = p_Var16->_M_next;
          paVar10 = pMesh->mNormals;
          *(undefined4 *)((long)&paVar10->z + lVar11) = *(undefined4 *)&p_Var9->_M_prev;
          *(_List_node_base **)((long)&paVar10->x + lVar11) = p_Var7;
          uVar21 = uVar21 + 1;
          lVar11 = lVar11 + 0xc;
        } while (uVar21 < pMesh->mNumVertices);
      }
    }
    else {
      if ((long)piVar6 - (long)piVar5 !=
          (long)(local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_138 = &local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Normals and Coords inidces count must be equal.","");
        std::runtime_error::runtime_error(prVar12,(string *)&local_138);
        *(undefined ***)prVar12 = &PTR__runtime_error_007fd498;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_118,__n);
      piVar20 = (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (piVar20 !=
          (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          if (*piVar20 != -1) {
            local_138 = (long *)(long)*piVar20;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&local_118,(unsigned_long *)&local_138);
          }
          piVar20 = piVar20 + 1;
        } while (piVar20 !=
                 (pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      uVar21 = (ulong)pMesh->mNumVertices;
      paVar10 = (aiVector3D *)operator_new__(uVar21 * 0xc);
      if (uVar21 != 0) {
        memset(paVar10,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      pMesh->mNormals = paVar10;
      if (pMesh->mNumVertices != 0) {
        lVar11 = 0;
        uVar21 = 0;
        do {
          if ((ulong)((long)local_118.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_118.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar21) break;
          uVar17 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21];
          if ((ulong)(((long)local_f8.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              <= uVar17) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            to_string<unsigned_long>
                      (&local_90,
                       local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar21]);
            std::operator+(&local_70,"MeshGeometry_AddNormal. Normal index(",&local_90);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_d0._M_dataplus._M_p = (pointer)*plVar13;
            psVar14 = (size_type *)(plVar13 + 2);
            if ((size_type *)local_d0._M_dataplus._M_p == psVar14) {
              local_d0.field_2._M_allocated_capacity = *psVar14;
              local_d0.field_2._8_8_ = plVar13[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar14;
            }
            local_d0._M_string_length = plVar13[1];
            *plVar13 = (long)psVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            to_string<unsigned_long>
                      (&local_b0,
                       ((long)local_f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_f8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
            ;
            std::operator+(&local_50,&local_d0,&local_b0);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_138 = (long *)*plVar13;
            plVar15 = plVar13 + 2;
            if (local_138 == plVar15) {
              local_128 = *plVar15;
              lStack_120 = plVar13[3];
              local_138 = &local_128;
            }
            else {
              local_128 = *plVar15;
            }
            local_130 = plVar13[1];
            *plVar13 = (long)plVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::runtime_error::runtime_error(prVar12,(string *)&local_138);
            *(undefined ***)prVar12 = &PTR__runtime_error_007fd498;
            __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          paVar10 = pMesh->mNormals;
          *(float *)((long)&paVar10->z + lVar11) =
               local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar17].z;
          *(undefined8 *)((long)&paVar10->x + lVar11) =
               *(undefined8 *)
                (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17);
          uVar21 = uVar21 + 1;
          lVar11 = lVar11 + 0xc;
        } while (uVar21 < pMesh->mNumVertices);
      }
    }
  }
  else {
    if (piVar6 == piVar5) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&local_118,(ulong)pMesh->mNumFaces);
      local_138 = (long *)0x0;
      if (pMesh->mNumFaces != 0) {
        do {
          if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_118,
                       (iterator)
                       local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_138);
          }
          else {
            *local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_138;
            local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          local_138 = (long *)((long)local_138 + 1);
        } while (local_138 < (long *)(ulong)pMesh->mNumFaces);
      }
    }
    else {
      if (__n != pMesh->mNumFaces) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_138 = &local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"Normals faces count must be equal to mesh faces count.","")
        ;
        std::runtime_error::runtime_error(prVar12,(string *)&local_138);
        *(undefined ***)prVar12 = &PTR__runtime_error_007fd498;
        __cxa_throw(prVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_118,__n);
      lVar11 = (long)(pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pNormalIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 2;
        lVar18 = 0;
        do {
          local_138 = (long *)(long)piVar5[lVar18];
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&local_118,(unsigned_long *)&local_138);
          lVar18 = lVar18 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar18);
      }
    }
    uVar21 = (ulong)pMesh->mNumVertices;
    paVar10 = (aiVector3D *)operator_new__(uVar21 * 0xc);
    if (uVar21 != 0) {
      memset(paVar10,0,((uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mNormals = paVar10;
    if (pMesh->mNumFaces != 0) {
      uVar21 = 0;
      do {
        uVar17 = (ulong)pMesh->mFaces[uVar21].mNumIndices;
        if (uVar17 != 0) {
          uVar8 = local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar21];
          fVar1 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8].x;
          fVar2 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8].y;
          fVar3 = local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar8].z;
          uVar19 = 0;
          do {
            paVar10 = pMesh->mNormals;
            uVar4 = pMesh->mFaces[uVar21].mIndices[uVar19];
            paVar10[uVar4].x = fVar1;
            paVar10[uVar4].y = fVar2;
            paVar10[uVar4].z = fVar3;
            uVar19 = uVar19 + 1;
          } while (uVar17 != uVar19);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 < pMesh->mNumFaces);
    }
  }
  if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pNormalIdx,
								const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::vector<size_t> tind;
    std::vector<aiVector3D> norm_arr_copy;

	// copy list to array because we are need indexed access to normals.
	norm_arr_copy.reserve(pNormals.size());
    for ( std::list<aiVector3D>::const_iterator it = pNormals.begin(); it != pNormals.end(); ++it )
    {
        norm_arr_copy.push_back( *it );
    }

	if(pNormalPerVertex)
	{
		if(pNormalIdx.size() > 0)
		{
			// check indices array count.
			if(pNormalIdx.size() != pCoordIdx.size()) throw DeadlyImportError("Normals and Coords inidces count must be equal.");

			tind.reserve(pNormalIdx.size());
			for(std::vector<int32_t>::const_iterator it = pNormalIdx.begin(); it != pNormalIdx.end(); ++it)
			{
				if(*it != (-1)) tind.push_back(*it);
			}

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			for(size_t i = 0; (i < pMesh.mNumVertices) && (i < tind.size()); i++)
			{
				if(tind[i] >= norm_arr_copy.size())
					throw DeadlyImportError("MeshGeometry_AddNormal. Normal index(" + to_string(tind[i]) +
											") is out of range. Normals count: " + to_string(norm_arr_copy.size()) + ".");

				pMesh.mNormals[i] = norm_arr_copy[tind[i]];
			}
		}
		else
		{
			if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

			// copy normals to mesh
			pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
			std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();
			for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
		}
	}// if(pNormalPerVertex)
	else
	{
		if(pNormalIdx.size() > 0)
		{
			if(pMesh.mNumFaces != pNormalIdx.size()) throw DeadlyImportError("Normals faces count must be equal to mesh faces count.");

			std::vector<int32_t>::const_iterator normidx_it = pNormalIdx.begin();

			tind.reserve(pNormalIdx.size());
			for(size_t i = 0, i_e = pNormalIdx.size(); i < i_e; i++) tind.push_back(*normidx_it++);

		}
		else
		{
			tind.reserve(pMesh.mNumFaces);
			for(size_t i = 0; i < pMesh.mNumFaces; i++) tind.push_back(i);

		}

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			aiVector3D tnorm;

			tnorm = norm_arr_copy[tind[fi]];
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = tnorm;
		}
	}// if(pNormalPerVertex) else
}